

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FindDbName(sqlite3 *db,char *zName)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  Db *pDVar5;
  long lVar6;
  
  uVar2 = 0xffffffff;
  if (zName != (char *)0x0) {
    uVar2 = db->nDb - 1;
    uVar4 = (ulong)uVar2;
    if (0 < db->nDb) {
      pDVar5 = db->aDb + uVar4;
      do {
        iVar3 = (int)uVar4;
        if (pDVar5->zDbSName != (char *)0x0) {
          lVar6 = 0;
          do {
            bVar1 = pDVar5->zDbSName[lVar6];
            if (bVar1 == zName[lVar6]) {
              if ((ulong)bVar1 == 0) {
                return iVar3;
              }
            }
            else if (""[bVar1] != ""[(byte)zName[lVar6]]) break;
            lVar6 = lVar6 + 1;
          } while( true );
        }
        if (iVar3 == 0) {
          lVar6 = 0;
          do {
            bVar1 = "main"[lVar6];
            if (bVar1 == zName[lVar6]) {
              if ((ulong)bVar1 == 0) {
                return 0;
              }
            }
            else if (""[bVar1] != ""[(byte)zName[lVar6]]) break;
            lVar6 = lVar6 + 1;
          } while( true );
        }
        pDVar5 = pDVar5 + -1;
        uVar4 = (ulong)(iVar3 - 1);
        if (iVar3 < 1) {
          return -1;
        }
      } while( true );
    }
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindDbName(sqlite3 *db, const char *zName){
  int i = -1;         /* Database number */
  if( zName ){
    Db *pDb;
    for(i=(db->nDb-1), pDb=&db->aDb[i]; i>=0; i--, pDb--){
      if( 0==sqlite3_stricmp(pDb->zDbSName, zName) ) break;
      /* "main" is always an acceptable alias for the primary database
      ** even if it has been renamed using SQLITE_DBCONFIG_MAINDBNAME. */
      if( i==0 && 0==sqlite3_stricmp("main", zName) ) break;
    }
  }
  return i;
}